

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

Cells08 anon_unknown.dwarf_b455::SolverDpllTriadSimd<0>::HorizontalTriads(Cells16 *cells)

{
  Bitvec16x16 *in_RSI;
  Bitvec16x16 *in_RDI;
  Bitvec08x16 BVar1;
  Cells08 CVar2;
  Cells16 split_triads;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 in_stack_ffffffffffffff14;
  Bitvec08x16 *in_stack_ffffffffffffff18;
  Bitvec16x16 *in_stack_ffffffffffffff20;
  Bitvec16x16 *this;
  Bitvec08x16 local_a0;
  Bitvec08x16 local_90 [8];
  
  this = in_RDI;
  Bitvec08x16::Bitvec08x16(local_90,0xffff,0xffff,0xffff,0xffff,0x706,0xf0e,0xffff,0xffff);
  uVar3 = 0xffff;
  uVar4 = 0;
  Bitvec08x16::Bitvec08x16(&local_a0,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0x706,0xffff);
  Bitvec16x16::Bitvec16x16
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (Bitvec08x16 *)CONCAT44(in_stack_ffffffffffffff14,CONCAT22(uVar4,uVar3)));
  Bitvec16x16::Shuffle(this,in_RSI);
  Bitvec16x16::GetLo(in_stack_ffffffffffffff20);
  Bitvec16x16::GetHi(in_stack_ffffffffffffff20);
  BVar1 = Bitvec08x16::operator|((Bitvec08x16 *)in_RSI,(Bitvec08x16 *)in_stack_ffffffffffffff20);
  CVar2.vec[1] = BVar1.vec[1];
  CVar2.vec[0] = (longlong)in_RDI;
  return (Cells08)CVar2.vec;
}

Assistant:

static inline Cells08 HorizontalTriads(const Cells16 &cells) {
        Cells16 split_triads = cells.Shuffle(
                Bitvec16x16{{0xffff, 0xffff, 0xffff, 0xffff, shuf03, shuf07, 0xffff, 0xffff},
                            {0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, shuf03, 0xffff}});
        return split_triads.GetLo() | split_triads.GetHi();
    }